

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cpp
# Opt level: O0

void __thiscall pcplusplus::threads::producer_threads::thread_routine(producer_threads *this)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  int *__rep;
  generic_threads *in_RDI;
  size_t index;
  long num;
  timespec ts;
  long thread_id;
  ostream *in_stack_ffffffffffffff98;
  queue<long> *in_stack_ffffffffffffffa0;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffffc0;
  int local_2c;
  duration<long,std::ratio<1l,1000000l>> local_28 [8];
  long local_20;
  long local_18;
  long local_10;
  
  local_10 = syscall(0xba);
  generic_threads::lock((generic_threads *)0x10426e);
  poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4," started.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  generic_threads::unlock((generic_threads *)0x1042b6);
  while( true ) {
    if (in_RDI->target <= in_RDI->num_processed) {
      generic_threads::lock((generic_threads *)0x10455d);
      poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
      poVar4 = std::operator<<(poVar4," finished.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      generic_threads::unlock((generic_threads *)0x1045a5);
      return;
    }
    local_2c = 5;
    __rep = &local_2c;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_28,__rep);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(in_stack_ffffffffffffffc0);
    generic_threads::lock((generic_threads *)0x1042f4);
    while (bVar1 = queue<long>::isFull(in_RDI->buffer), bVar1) {
      generic_threads::wait(in_RDI,__rep);
    }
    if (in_RDI->num_processed == in_RDI->target) break;
    lVar5 = lrand48();
    in_stack_ffffffffffffffc0 =
         (duration<long,_std::ratio<1L,_1000000L>_> *)
         queue<long>::enqueue(in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98);
    timespec_get(&local_20,1);
    uVar6 = std::ofstream::is_open();
    if (((uVar6 & 1) != 0) &&
       (bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(&in_RDI->logfile + *(long *)(*(long *)&in_RDI->logfile + -0x18)))
       , bVar1)) {
      uVar7 = std::ostream::operator<<((ostream *)&in_RDI->logfile,local_20);
      _Var2 = std::setfill<char>('0');
      in_stack_ffffffffffffff98 = std::operator<<(uVar7,_Var2._M_c);
      _Var3 = std::setw(9);
      poVar4 = std::operator<<(in_stack_ffffffffffffff98,_Var3);
      in_stack_ffffffffffffffa0 = (queue<long> *)std::ostream::operator<<(poVar4,local_18);
      _Var3 = std::setw(0);
      poVar4 = std::operator<<((ostream *)in_stack_ffffffffffffffa0,_Var3);
      poVar4 = std::operator<<(poVar4," Producer ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)in_stack_ffffffffffffffc0);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
    poVar4 = std::operator<<(poVar4," produced ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar5);
    poVar4 = std::operator<<(poVar4," and stored it at index ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)in_stack_ffffffffffffffc0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    in_RDI->num_processed = in_RDI->num_processed + 1;
    generic_threads::unlock((generic_threads *)0x104544);
    generic_threads::notify((generic_threads *)0x10454e);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Producer thread ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4," finished.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  generic_threads::unlock((generic_threads *)0x10436e);
  return;
}

Assistant:

void producer_threads::thread_routine(){
	const auto thread_id = GET_TID;
	struct timespec ts;
	lock();
	std::cout << "Producer thread " << thread_id << " started." << std::endl;
	unlock();
	while(num_processed < target){
	    std::this_thread::sleep_for(std::chrono::microseconds(5));//sleep for 5 microseconds so that other producer threads have an opportunity to acquire the mutex
	    lock();
	    while(buffer->isFull()){
		wait();
	    }
	    if(num_processed == target){
		std::cout << "Producer thread " << thread_id << " finished." << std::endl;
		unlock();
		return;
	    }

	    const long num = lrand48();
	    const size_t index = buffer->enqueue(num);
	    timespec_get(&ts, TIME_UTC);
	    if(logfile.is_open() && logfile)
		logfile << ts.tv_sec << std::setfill('0') << std::setw(9) << ts.tv_nsec << std::setw(0) << " Producer " << thread_id << " " << index << " " << num << std::endl;

	    std::cout << "Producer thread " << thread_id << " produced " << num << " and stored it at index " << index << std::endl;
	    ++num_processed;
	    unlock();
	    notify();
	}
	lock();
	std::cout << "Producer thread " << thread_id << " finished." << std::endl;
	unlock();
    }